

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

int get_digit(int base)

{
  int iVar1;
  int iVar2;
  ushort **ppuVar3;
  int in_EDI;
  int bc;
  int bl;
  
  if (in_EDI == 10) {
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[l] & 0x800) != 0) {
      readbyte();
      return c + -0x30;
    }
  }
  else if (in_EDI == 0x10) {
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[l] & 0x800) != 0) {
      readbyte();
      return c + -0x30;
    }
    if ((0x60 < l) && (l < 0x67)) {
      readbyte();
      return c + -0x57;
    }
    if ((0x40 < l) && (l < 0x47)) {
      readbyte();
      return c + -0x37;
    }
  }
  else if ((in_EDI == 8) && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[l] & 0x800) != 0)) {
    readbyte();
    iVar2 = ecolumn;
    iVar1 = eline;
    if ((0x2f < c) && (c < 0x38)) {
      return c + -0x30;
    }
    err(E,"invalid digit \"%c\" in octal constant",(ulong)(uint)c);
    eline = iVar1;
    ecolumn = iVar2;
  }
  return -1;
}

Assistant:

int get_digit(int base)
{
    if (base == 10)
    {
        if (isdigit(l))
        {
            readbyte();
            return (c - '0');
        }
    }
    else if (base == 16)
    {
        if (isdigit(l))
        {
            readbyte();
            return (c - '0');
        }
        else if (l >= 'a' && l <= 'f')
        {
            readbyte();
            return (c - 'a' + 10);
        }
        else if (l >= 'A' && l <= 'F')
        {
            readbyte();
            return (c - 'A' + 10);
        }
    }
    else if (base == 8)
    {
        /* accept all digits so we don't have to treat non octal digits as
        a suffix */
        if (isdigit(l))
        {

            readbyte();
            if (c >= '0' && c <= '7')
            {
                return (c - '0');
            }
            else
            {
                /* backup of error line and column because the parser assumes
                that they are set to the start of the current token and does not
                update them */
                int bl = eline;
                int bc = ecolumn;
                err(E, "invalid digit \"%c\" in octal constant", c);
                eline = bl;
                ecolumn = bc;
            }
        }
    }

    return -1;
}